

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O1

void __thiscall amrex::FABio_ascii::skip(FABio_ascii *this,istream *is,FArrayBox *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  char cStack_51;
  IntVect IStack_50;
  int iStack_40;
  IntVect IStack_3c;
  
  iStack_40 = (f->super_BaseFab<double>).domain.bigend.vect[0];
  iVar1 = (f->super_BaseFab<double>).domain.bigend.vect[1];
  iVar2 = (f->super_BaseFab<double>).domain.bigend.vect[2];
  IStack_3c.vect[0] = 0;
  IStack_3c.vect[1] = 0;
  IStack_3c.vect[2] = 0;
  IStack_50.vect[2] = (f->super_BaseFab<double>).domain.smallend.vect[2];
  IStack_50.vect._0_8_ = *(undefined8 *)(f->super_BaseFab<double>).domain.smallend.vect;
  if (IStack_50.vect[2] <= iVar2) {
    do {
      if ((iVar2 == IStack_50.vect[2]) &&
         ((iVar1 < IStack_50.vect[1] ||
          ((iVar1 == IStack_50.vect[1] && (iStack_40 < IStack_50.vect[0])))))) break;
      amrex::operator>>(is,&IStack_3c);
      if ((IStack_50.vect[0] != IStack_3c.vect[0]) ||
         ((IStack_50.vect[1] != IStack_3c.vect[1] || (IStack_50.vect[2] != IStack_3c.vect[2])))) {
        poVar5 = ErrorStream();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Error: read IntVect ",0x14);
        poVar5 = amrex::operator<<(poVar5,&IStack_3c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  should be ",0xc);
        poVar5 = amrex::operator<<(poVar5,&IStack_50);
        cStack_51 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&cStack_51,1);
        Error_host("FABio_ascii::read() bad IntVect");
      }
      if (0 < (f->super_BaseFab<double>).nvar) {
        lVar6 = 0;
        do {
          std::istream::_M_extract<double>((double *)is);
          lVar6 = lVar6 + 1;
        } while (lVar6 < (f->super_BaseFab<double>).nvar);
      }
      iVar3 = IStack_50.vect[0];
      iVar4 = IStack_50.vect[1];
      IStack_50.vect[0] = IStack_50.vect[0] + 1;
      if ((f->super_BaseFab<double>).domain.bigend.vect[0] <= iVar3) {
        IStack_50.vect[0] = (f->super_BaseFab<double>).domain.smallend.vect[0];
        IStack_50.vect[1] = IStack_50.vect[1] + 1;
        if ((f->super_BaseFab<double>).domain.bigend.vect[1] <= iVar4) {
          IStack_50.vect[1] = (f->super_BaseFab<double>).domain.smallend.vect[1];
          IStack_50.vect[2] = IStack_50.vect[2] + 1;
        }
      }
    } while (IStack_50.vect[2] <= iVar2);
  }
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
    Error_host("FABio_ascii::read() failed");
  }
  return;
}

Assistant:

void
FABio_ascii::skip (std::istream& is,
                   FArrayBox&    f) const
{
#ifdef AMREX_USE_GPU
    if (f.arena()->isManaged() || f.arena()->isDevice()) {
        FArrayBox hostfab(f.box(), f.nComp(), The_Pinned_Arena());
        FABio_ascii::read(is, hostfab);
        Gpu::htod_memcpy_async(f.dataPtr(), hostfab.dataPtr(), f.size()*sizeof(Real));
        Gpu::streamSynchronize();
    } else
#endif
    {
        FABio_ascii::read(is, f);
    }
}